

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,MatrixView<const_double> *world_T_base,Span<const_double,__1L> s
          ,Span<const_double,__1L> base_velocity,Span<const_double,__1L> s_dot,
          Span<const_double,__1L> world_gravity)

{
  Span<const_double,__1L> vec;
  index_type iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  MatrixView<const_double> *in_RSI;
  MatrixView<const_double> *in_RDI;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int expected_twist_size;
  bool ok;
  int expected_transform_rows;
  int expected_transform_cols;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  MatrixView<const_double> *this_00;
  extent_type<_1L> eVar2;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 uVar3;
  VectorDynSize local_258 [24];
  SpatialVector<iDynTree::SpatialMotionVector> *in_stack_fffffffffffffdc0;
  storage_type<iDynTree::details::extent_type<_1L>_> in_stack_fffffffffffffdc8;
  SpatialVector local_218 [48];
  SpatialMotionVector local_1e8;
  Twist local_1b8 [48];
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  VectorDynSize local_178 [32];
  MatrixView<const_double> local_158;
  MatrixFixSize local_128 [120];
  Vector3 *in_stack_ffffffffffffff50;
  VectorDynSize *in_stack_ffffffffffffff58;
  Twist *in_stack_ffffffffffffff60;
  VectorDynSize *in_stack_ffffffffffffff68;
  Transform *in_stack_ffffffffffffff70;
  KinDynComputations *in_stack_ffffffffffffff78;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  bool local_1;
  
  iVar1 = MatrixView<const_double>::rows(in_RSI);
  uVar3 = false;
  if (iVar1 == 4) {
    iVar1 = MatrixView<const_double>::cols(in_RSI);
    uVar3 = iVar1 == 4;
  }
  if ((bool)uVar3 == false) {
    iDynTree::reportError("KinDynComputations","setRobotState","Wrong size in input world_T_base");
    local_1 = false;
  }
  else {
    iVar1 = Span<const_double,_-1L>::size((Span<const_double,__1L> *)0x1c8cb0);
    if (iVar1 == 6) {
      this_00 = &local_158;
      MatrixView<const_double>::MatrixView
                (this_00,(MatrixView<const_double> *)
                         CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      eVar2.size_ = (index_type)local_128;
      MatrixFixSize<4U,_4U>::MatrixFixSize
                ((MatrixFixSize<4U,_4U> *)CONCAT17(uVar3,in_stack_fffffffffffffd60),in_RDI);
      iDynTree::Transform::Transform
                ((Transform *)&stack0xffffffffffffff58,(MatrixFixSize *)eVar2.size_);
      local_18 = (undefined4)in_RDX;
      uStack_14 = (undefined4)((ulong)in_RDX >> 0x20);
      uStack_10 = (undefined4)in_RCX;
      uStack_c = (undefined4)((ulong)in_RCX >> 0x20);
      local_188 = local_18;
      uStack_184 = uStack_14;
      uStack_180 = uStack_10;
      uStack_17c = uStack_c;
      iDynTree::VectorDynSize::VectorDynSize(local_178,in_RDX,in_RCX);
      SpatialVector<iDynTree::SpatialMotionVector>::SpatialVector
                (in_stack_fffffffffffffdc0,(Span<const_double,__1L>)in_stack_fffffffffffffdc8);
      iDynTree::SpatialMotionVector::SpatialMotionVector(&local_1e8,local_218);
      iDynTree::Twist::Twist(local_1b8,&local_1e8);
      iDynTree::VectorDynSize::VectorDynSize(local_258,in_stack_00000008,in_stack_00000010);
      vec.storage_.data_ = (pointer)in_RSI;
      vec.storage_.super_extent_type<_1L>.size_ = eVar2.size_;
      VectorFixSize<3U>::VectorFixSize((VectorFixSize<3U> *)this_00,vec);
      local_1 = setRobotState(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      iDynTree::VectorDynSize::~VectorDynSize(local_258);
      iDynTree::VectorDynSize::~VectorDynSize(local_178);
    }
    else {
      iDynTree::reportError
                ("KinDynComputations","setRobotState","Wrong size in input base_velocity");
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool KinDynComputations::setRobotState(iDynTree::MatrixView<const double> world_T_base,
                                       Span<const double> s,
                                       Span<const double> base_velocity,
                                       Span<const double> s_dot,
                                       Span<const double> world_gravity)

{

    constexpr int expected_transform_cols = 4;
    constexpr int expected_transform_rows = 4;
    bool ok = (world_T_base.rows() == expected_transform_rows) && (world_T_base.cols() == expected_transform_cols);
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input world_T_base");
        return false;
    }

    constexpr int expected_twist_size = 6;
    ok = base_velocity.size() == expected_twist_size;
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input base_velocity");
        return false;
    }


    return this->setRobotState(iDynTree::Transform(world_T_base),
                               s,
                               iDynTree::SpatialMotionVector(base_velocity),
                               s_dot,
                               world_gravity);
}